

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O3

void continuous_dist_test_icdf<trng::cauchy_dist<float>>(cauchy_dist<float> *d)

{
  long lVar1;
  pointer pfVar2;
  ulong uVar3;
  int i;
  int iVar4;
  pointer pfVar5;
  result_type_conflict1 rVar6;
  float fVar7;
  uint extraout_XMM0_Db;
  uint extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  float eps;
  vector<float,_std::allocator<float>_> p_values;
  AssertionHandler catchAssertionHandler;
  float local_10c;
  vector<float,_std::allocator<float>_> local_108;
  float local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  float local_d0;
  float local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  float *local_a8;
  char *local_a0;
  size_t sStack_98;
  float *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  
  local_10c = 3.0517578e-05;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_78.m_assertionInfo.macroName.m_start._0_4_ = 0.5;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&local_108,(iterator)0x0,(float *)&local_78);
  iVar4 = 2;
  do {
    local_e8 = (float)iVar4;
    local_78.m_assertionInfo.macroName.m_start._0_4_ =
         powf(*local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,local_e8);
    local_78.m_assertionInfo.macroName.m_start._0_4_ =
         local_78.m_assertionInfo.macroName.m_start._0_4_ + 0.0;
    if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_78);
    }
    else {
      *local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_78.m_assertionInfo.macroName.m_start._0_4_;
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    local_78.m_assertionInfo.macroName.m_start._0_4_ =
         powf(*local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,local_e8);
    local_78.m_assertionInfo.macroName.m_start._0_4_ =
         1.0 - local_78.m_assertionInfo.macroName.m_start._0_4_;
    if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish ==
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish,(float *)&local_78);
    }
    else {
      *local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish = local_78.m_assertionInfo.macroName.m_start._0_4_;
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    pfVar5 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pfVar2 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x18);
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar3 = (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    lVar1 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pfVar2,pfVar5);
    pfVar2 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pfVar5 = local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_e8 = *pfVar5;
        rVar6 = trng::cauchy_dist<float>::icdf(d,local_e8);
        fVar7 = atanf((rVar6 - (d->P).eta_) / (d->P).theta_);
        fVar7 = ABS((fVar7 * 0.31830987 + 0.5) - local_e8);
        if (3.0517578e-05 <= fVar7) {
          local_b8._vptr_ITransientExpression = (_func_int **)0x2a6457;
          local_b8.m_isBinaryExpression = true;
          local_b8.m_result = false;
          local_b8._10_6_ = 0;
          local_c8.file =
               "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
          ;
          local_c8.line = 0xa8;
          local_e8 = fVar7;
          uStack_e4 = extraout_XMM0_Db & 0x7fffffff;
          uStack_e0 = extraout_XMM0_Dc & 0x7fffffff;
          uStack_dc = extraout_XMM0_Dd & 0x7fffffff;
          Catch::StringRef::StringRef(&local_88,"std::abs(y - p) < eps");
          Catch::AssertionHandler::AssertionHandler
                    (&local_78,(StringRef *)&local_b8,&local_c8,local_88,Normal);
          local_cc = local_e8;
          local_d0 = local_10c;
          Catch::StringRef::StringRef((StringRef *)&local_c8,"<");
          local_b8.m_result = local_e8 < local_d0;
          local_b8.m_isBinaryExpression = true;
          local_b8._vptr_ITransientExpression =
               (_func_int **)&PTR_streamReconstructedExpression_003182b8;
          local_a8 = &local_cc;
          local_a0 = local_c8.file;
          sStack_98 = local_c8.line;
          local_90 = &local_10c;
          Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
          Catch::ITransientExpression::~ITransientExpression(&local_b8);
          Catch::AssertionHandler::complete(&local_78);
          if (local_78.m_completed == false) {
            (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                      (local_78.m_resultCapture,&local_78);
          }
        }
        pfVar5 = pfVar5 + 1;
      } while (pfVar5 != pfVar2);
    }
  }
  if (local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_108.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_icdf(const dist &d) {
  using result_type = typename dist::result_type;
  const auto eps{256 * std::numeric_limits<result_type>::epsilon()};
  std::vector<result_type> p_values;
  p_values.push_back(result_type{1} / result_type{2});
  for (int i{2}; i < std::numeric_limits<result_type>::digits; ++i) {
    p_values.push_back(result_type{0} + std::pow(p_values[0], result_type(i)));
    p_values.push_back(result_type{1} - std::pow(p_values[0], result_type(i)));
  }
  std::sort(p_values.begin(), p_values.end());
  for (const auto p : p_values) {
    const result_type x{d.icdf(p)};
    const result_type y{d.cdf(x)};
    if (not(std::abs(y - p) <
            eps))  // switch into REQUIRE macro in failure case only, for performance reasons
      REQUIRE(std::abs(y - p) < eps);
  }
}